

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O3

Ivy_Man_t * Ivy_ManDup(Ivy_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *in_RAX;
  Vec_Int_t *__ptr;
  Ivy_Man_t *p_00;
  Ivy_Obj_t *pIVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  Ivy_Obj_t *p1;
  long lVar8;
  Vec_Int_t *vLatches;
  Vec_Int_t *local_38;
  
  local_38 = in_RAX;
  __ptr = Ivy_ManDfsSeq(p,&local_38);
  p_00 = Ivy_ManStart();
  p->pConst1->pEquiv = p_00->pConst1;
  pVVar5 = p->vPis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar8];
      pIVar4 = Ivy_ObjCreatePi(p_00);
      *(Ivy_Obj_t **)((long)pvVar2 + 0x48) = pIVar4;
      lVar8 = lVar8 + 1;
      pVVar5 = p->vPis;
    } while (lVar8 < pVVar5->nSize);
  }
  if (0 < local_38->nSize) {
    lVar8 = 0;
    do {
      iVar3 = local_38->pArray[lVar8];
      if (((long)iVar3 < 0) || (p->vObjs->nSize <= iVar3)) goto LAB_007f4c2c;
      pvVar2 = p->vObjs->pArray[iVar3];
      if (pvVar2 == (void *)0x0) break;
      pIVar4 = Ivy_ObjCreatePi(p_00);
      *(Ivy_Obj_t **)((long)pvVar2 + 0x48) = pIVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_38->nSize);
  }
  iVar3 = __ptr->nSize;
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      iVar1 = __ptr->pArray[lVar8];
      if (((long)iVar1 < 0) || (p->vObjs->nSize <= iVar1)) goto LAB_007f4c2c;
      pvVar2 = p->vObjs->pArray[iVar1];
      if (pvVar2 == (void *)0x0) break;
      if ((*(uint *)((long)pvVar2 + 8) & 0xf) == 7) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_007f4c4b;
        uVar7 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x48);
        }
        *(ulong *)((long)pvVar2 + 0x48) = uVar7;
      }
      else {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_007f4c4b;
        uVar7 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pIVar4 = (Ivy_Obj_t *)0x0;
        }
        else {
          pIVar4 = (Ivy_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x48));
        }
        uVar7 = *(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p1 = (Ivy_Obj_t *)0x0;
        }
        else {
          p1 = (Ivy_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x18) & 1) ^ *(ulong *)(uVar7 + 0x48));
        }
        pIVar4 = Ivy_And(p_00,pIVar4,p1);
        *(Ivy_Obj_t **)((long)pvVar2 + 0x48) = pIVar4;
        iVar3 = __ptr->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  pVVar5 = p->vPos;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      if (((ulong)pVVar5->pArray[lVar8] & 1) != 0) goto LAB_007f4c4b;
      uVar7 = *(ulong *)((long)pVVar5->pArray[lVar8] + 0x10);
      uVar6 = uVar7 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pIVar4 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar4 = (Ivy_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar6 + 0x48));
      }
      Ivy_ObjCreatePo(p_00,pIVar4);
      lVar8 = lVar8 + 1;
      pVVar5 = p->vPos;
    } while (lVar8 < pVVar5->nSize);
  }
  if (0 < local_38->nSize) {
    lVar8 = 0;
    do {
      iVar3 = local_38->pArray[lVar8];
      if (((long)iVar3 < 0) || (p->vObjs->nSize <= iVar3)) {
LAB_007f4c2c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vObjs->pArray[iVar3];
      if (pvVar2 == (void *)0x0) break;
      if ((*(byte *)((long)pvVar2 + 0x10) & 1) != 0) {
        __assert_fail("!Ivy_ObjFaninC0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                      ,0x8b,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
      }
      *(uint *)(*(long *)((long)pvVar2 + 0x48) + 8) =
           *(uint *)(*(long *)((long)pvVar2 + 0x48) + 8) & 0xfffffff0 | 4;
      *(uint *)(*(long *)((long)pvVar2 + 0x48) + 8) =
           *(uint *)(*(long *)((long)pvVar2 + 0x48) + 8) & 0xfffff9ff |
           *(uint *)((long)pvVar2 + 8) & 0x600;
      if (((ulong)pvVar2 & 1) != 0) {
LAB_007f4c4b:
        __assert_fail("!Ivy_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                      ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pIVar4 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar4 = (Ivy_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x48));
      }
      Ivy_ObjConnect(p_00,*(Ivy_Obj_t **)((long)pvVar2 + 0x48),pIVar4,(Ivy_Obj_t *)0x0);
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_38->nSize);
  }
  if (p_00->vPis->nSize < p->nObjs[1]) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  p_00->vPis->nSize = p->nObjs[1];
  p_00->nObjs[1] = p_00->nObjs[1] - p->nObjs[4];
  p_00->nObjs[4] = p_00->nObjs[4] + p->nObjs[4];
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  if (p->nObjs[6] + p->nObjs[5] == p_00->nObjs[6] + p_00->nObjs[5]) {
    if (p->nObjs[4] == p_00->nObjs[4]) {
      iVar3 = Ivy_ManCheck(p_00);
      if (iVar3 == 0) {
        puts("Ivy_ManMakeSeq(): The check has failed.");
      }
      return p_00;
    }
    __assert_fail("Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x9a,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
  }
  __assert_fail("Ivy_ManNodeNum(p) == Ivy_ManNodeNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                ,0x99,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
}

Assistant:

Ivy_Man_t * Ivy_ManDup( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // create the fake PIs for latches
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        if ( Ivy_ObjIsBuf(pObj) )
            pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
        else
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // add the POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(pObj) );
    // transform additional PI nodes into latches and connect them
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        pObj->pEquiv->Type = IVY_LATCH;
        pObj->pEquiv->Init = pObj->Init;
        Ivy_ObjConnect( pNew, pObj->pEquiv, Ivy_ObjChild0Equiv(pObj), NULL );
    }
    // shrink the arrays
    Vec_PtrShrink( pNew->vPis, Ivy_ManPiNum(p) );
    // update the counters of different objects
    pNew->nObjs[IVY_PI] -= Ivy_ManLatchNum(p);
    pNew->nObjs[IVY_LATCH] += Ivy_ManLatchNum(p);
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
    // make sure structural hashing did not change anything
    assert( Ivy_ManNodeNum(p)  == Ivy_ManNodeNum(pNew) );
    assert( Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew) );
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
    return pNew;
}